

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDerivativesPreproc.cc
# Opt level: O2

int main(void)

{
  double dVar1;
  double dVar2;
  ostream *poVar3;
  ulong uVar4;
  int io_1;
  int jp;
  ulong uVar5;
  int jp_1;
  long lVar6;
  ulong uVar7;
  double *e;
  double *pdVar8;
  long lVar9;
  ulong uVar10;
  initializer_list<int> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  bool local_9fd;
  uint local_9fc;
  vector<double,_std::allocator<double>_> vp;
  vector<double,_std::allocator<double>_> vm;
  vector<double,_std::allocator<double>_> parsprep;
  _Any_data local_998;
  undefined8 local_988;
  undefined8 uStack_980;
  vector<double,_std::allocator<double>_> pars;
  vector<double,_std::allocator<double>_> x;
  vector<int,_std::allocator<int>_> arch;
  _Vector_base<double,_std::allocator<double>_> local_928;
  vector<double,_std::allocator<double>_> ders;
  Preprocessing Preproc;
  vector<double,_std::allocator<double>_> nnl;
  vector<double,_std::allocator<double>_> parsm;
  vector<double,_std::allocator<double>_> parsp;
  vector<double,_std::allocator<double>_> prepf;
  vector<double,_std::allocator<double>_> anders;
  FeedForwardNN<double> nnm;
  FeedForwardNN<double> nnp;
  FeedForwardNN<double> nn;
  
  nn._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x500000001;
  nn._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x200000005;
  __l._M_len = 4;
  __l._M_array = (iterator)&nn;
  std::vector<int,_std::allocator<int>_>::vector(&arch,__l,(allocator_type *)&nnp);
  Preproc.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  Preproc.super__Function_base._M_functor._8_8_ = 0;
  Preproc._M_invoker =
       std::
       _Function_handler<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/rabah-khalek[P]NNAD/tests/TestDerivativesPreproc.cc:16:56)>
       ::_M_invoke;
  Preproc.super__Function_base._M_manager =
       std::
       _Function_handler<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/rabah-khalek[P]NNAD/tests/TestDerivativesPreproc.cc:16:56)>
       ::_M_manager;
  nn._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x4000000000000000;
  nn._ActFun.super__Function_base._M_functor._M_unused._M_object = (void *)0x4008000000000000;
  nn._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0xbff0000000000000;
  nn._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x3ff0000000000000;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&nn;
  std::vector<double,_std::allocator<double>_>::vector(&parsprep,__l_00,(allocator_type *)&nnp);
  vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_ << 0x20);
  local_998._0_4_ = 1;
  x.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start.
  _0_1_ = 1;
  nnp._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  nnp._ActFun.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  nnp._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  nnp._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)nnad::Sigmoid<double>;
  anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::
                _M_manager;
  nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)nnad::dSigmoid<double>;
  nnm._ActFun.super__Function_base._M_functor._M_unused._M_object =
       std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::_M_invoke;
  nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::
                _M_manager;
  nnad::FeedForwardNN<double>::FeedForwardNN
            (&nn,&arch,(int *)&vm,(bool *)&x,(function<double_(const_double_&)> *)&anders,
             (function<double_(const_double_&)> *)&nnm,(OutputFunction *)local_998._M_pod_data,
             (Preprocessing *)&nnp,&vp);
  std::_Function_base::~_Function_base((_Function_base *)&nnm);
  std::_Function_base::~_Function_base((_Function_base *)&anders);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&vp.super__Vector_base<double,_std::allocator<double>_>);
  std::_Function_base::~_Function_base((_Function_base *)&nnp);
  vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffff00000000);
  vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,2);
  local_998._M_pod_data[0] = 1;
  anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)nnad::Sigmoid<double>;
  nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::
                _M_manager;
  nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)nnad::dSigmoid<double>;
  nnm._ActFun.super__Function_base._M_functor._M_unused._M_object =
       std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::_M_invoke;
  nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::
                _M_manager;
  nnad::FeedForwardNN<double>::FeedForwardNN
            (&nnp,&arch,(int *)&vp,(bool *)local_998._M_pod_data,
             (function<double_(const_double_&)> *)&anders,(function<double_(const_double_&)> *)&nnm,
             (OutputFunction *)&vm,&Preproc,&parsprep);
  std::_Function_base::~_Function_base((_Function_base *)&nnm);
  std::_Function_base::~_Function_base((_Function_base *)&anders);
  anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x3f50624dd2f1a9fc;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&anders;
  std::vector<double,_std::allocator<double>_>::vector(&x,__l_01,(allocator_type *)&nnm);
  std::operator<<((ostream *)&std::cout,"Input: x = { ");
  for (pdVar8 = (double *)
                CONCAT71(x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,
                         x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start._0_1_);
      pdVar8 != x.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar8 = pdVar8 + 1) {
    poVar3 = std::ostream::_M_insert<double>(*pdVar8);
    std::operator<<(poVar3," ");
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"}\n");
  std::endl<char,std::char_traits<char>>(poVar3);
  nnad::FeedForwardNN<double>::Evaluate(&nnl,&nn,&x);
  std::
  function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
  ::operator()(&prepf,&Preproc,&x,&parsprep);
  nnad::FeedForwardNN<double>::GetParameters(&pars,&nn);
  uVar7 = (ulong)((long)pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  for (lVar9 = 0;
      lVar9 < arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish[-1]; lVar9 = lVar9 + 1) {
    anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)(nnl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar9] *
                         nnl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar9] *
                        prepf.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar9]);
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(&ders,(double *)&anders);
  }
  uVar10 = 0;
  uVar4 = 0;
  if (0 < (int)uVar7) {
    uVar4 = uVar7 & 0xffffffff;
  }
  while( true ) {
    if (uVar10 == uVar4) break;
    std::vector<double,_std::allocator<double>_>::vector
              (&parsp,(long)pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3,(allocator_type *)&anders);
    std::vector<double,_std::allocator<double>_>::vector
              (&parsm,(long)pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3,(allocator_type *)&anders);
    for (uVar5 = 0; (uVar7 & 0xffffffff) != uVar5; uVar5 = uVar5 + 1) {
      if (uVar10 == uVar5) {
        parsp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar10] =
             pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar10] * 1.00001;
        dVar1 = pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar10] * 0.99999;
      }
      else {
        dVar1 = pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5];
        parsp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar5] = dVar1;
      }
      parsm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar5] = dVar1;
    }
    nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)nnad::Sigmoid<double>;
    nnm._ActFun.super__Function_base._M_functor._M_unused._M_object =
         std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::_M_invoke;
    vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::
                  _M_manager;
    vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)nnad::dSigmoid<double>;
    vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::
                  _M_manager;
    local_928._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_928._M_impl.super__Vector_impl_data._M_start._4_4_,1);
    local_9fc = local_9fc & 0xffffff00;
    vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_998._M_unused._M_object = (void *)0x0;
    local_998._8_8_ = 0;
    local_988 = 0;
    nnad::FeedForwardNN<double>::FeedForwardNN
              ((FeedForwardNN<double> *)&anders,&arch,&parsp,
               (function<double_(const_double_&)> *)&nnm,(function<double_(const_double_&)> *)&vp,
               (OutputFunction *)&local_928,(bool *)&local_9fc,(Preprocessing *)&vm,
               (vector<double,_std::allocator<double>_> *)&local_998);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&local_998);
    std::_Function_base::~_Function_base((_Function_base *)&vm);
    std::_Function_base::~_Function_base((_Function_base *)&vp);
    std::_Function_base::~_Function_base((_Function_base *)&nnm);
    vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)nnad::Sigmoid<double>;
    vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::
                  _M_manager;
    vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)nnad::dSigmoid<double>;
    vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::_Function_handler<double_(const_double_&),_double_(*)(const_double_&)>::
                  _M_manager;
    local_9fc = 1;
    local_9fd = false;
    local_988 = 0;
    uStack_980 = 0;
    local_998._M_unused._M_object = (void *)0x0;
    local_998._8_8_ = 0;
    local_928._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_928._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_928._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    nnad::FeedForwardNN<double>::FeedForwardNN
              (&nnm,&arch,&parsm,(function<double_(const_double_&)> *)&vp,
               (function<double_(const_double_&)> *)&vm,&local_9fc,&local_9fd,
               (Preprocessing *)&local_998,(vector<double,_std::allocator<double>_> *)&local_928);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_928);
    std::_Function_base::~_Function_base((_Function_base *)&local_998);
    std::_Function_base::~_Function_base((_Function_base *)&vm);
    std::_Function_base::~_Function_base((_Function_base *)&vp);
    nnad::FeedForwardNN<double>::Evaluate(&vp,(FeedForwardNN<double> *)&anders,&x);
    nnad::FeedForwardNN<double>::Evaluate(&vm,&nnm,&x);
    for (lVar9 = 0;
        lVar9 < arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish[-1]; lVar9 = lVar9 + 1) {
      local_998._M_unused._0_8_ =
           (undefined8)
           (((((vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar9] -
               vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar9]) *
               (nnl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar9] +
               nnl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar9]) * 0.5) / 1e-05) /
            pars.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
            ._M_start[uVar10]) *
           prepf.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_start[lVar9]);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&ders,(double *)&local_998)
      ;
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&vm.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&vp);
    nnad::FeedForwardNN<double>::~FeedForwardNN(&nnm);
    nnad::FeedForwardNN<double>::~FeedForwardNN((FeedForwardNN<double> *)&anders);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&parsm.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&parsp.super__Vector_base<double,_std::allocator<double>_>);
    uVar10 = uVar10 + 1;
  }
  for (lVar9 = 0;
      lVar9 < (int)((ulong)((long)parsprep.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)parsprep.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3); lVar9 = lVar9 + 1)
  {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               &anders.super__Vector_base<double,_std::allocator<double>_>,
               (long)parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3,(allocator_type *)&nnm);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&nnm,
               (long)parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3,(allocator_type *)&vp);
    for (lVar6 = 0;
        (long)parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 != lVar6; lVar6 = lVar6 + 1) {
      if (lVar9 == lVar6) {
        anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar9] =
             parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar9] * 1.00001;
        dVar1 = parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar9] * 0.99999;
      }
      else {
        dVar1 = parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6];
        anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar6] = dVar1;
      }
      *(double *)
       (nnm._Arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start + lVar6 * 2) = dVar1;
    }
    std::
    function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
    ::operator()(&vp,&Preproc,&x,
                 (vector<double,_std::allocator<double>_> *)
                 &anders.super__Vector_base<double,_std::allocator<double>_>);
    std::
    function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
    ::operator()(&vm,&Preproc,&x,(vector<double,_std::allocator<double>_> *)&nnm);
    for (lVar6 = 0;
        lVar6 < arch.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish[-1]; lVar6 = lVar6 + 1) {
      local_998._M_unused._0_8_ =
           (undefined8)
           ((((vp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar6] -
              vm.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar6]) *
              nnl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar6] *
              nnl.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar6] * 0.5) / 1e-05) /
           parsprep.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar9]);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(&ders,(double *)&local_998)
      ;
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&vm.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&vp.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&nnm);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&anders.super__Vector_base<double,_std::allocator<double>_>);
  }
  nnad::FeedForwardNN<double>::Derive(&anders,&nnp,&x);
  uVar10 = (long)anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
  *(uint *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::__throw_out_of_range + *(long *)(std::cout + -0x18)) & 0xfffffefb | 0x100;
  poVar3 = std::operator<<((ostream *)&std::cout,"id\t num. ders.\t an. ders.\t   ratio");
  std::endl<char,std::char_traits<char>>(poVar3);
  uVar10 = uVar10 >> 3;
  uVar4 = 0;
  uVar7 = uVar10 & 0xffffffff;
  if ((int)uVar10 < 1) {
    uVar7 = uVar4;
  }
  for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar4);
    std::operator<<(poVar3,"\t");
    poVar3 = std::ostream::_M_insert<double>
                       (ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar4]);
    std::operator<<(poVar3,"\t");
    poVar3 = std::ostream::_M_insert<double>
                       (anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar4]);
    std::operator<<(poVar3,"\t");
    dVar1 = anders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar4];
    dVar2 = 0.0;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      dVar2 = ders.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar4] / dVar1;
    }
    poVar3 = std::ostream::_M_insert<double>(dVar2);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&anders.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ders.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&pars.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&prepf.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&nnl.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&x.super__Vector_base<double,_std::allocator<double>_>);
  nnad::FeedForwardNN<double>::~FeedForwardNN(&nnp);
  nnad::FeedForwardNN<double>::~FeedForwardNN(&nn);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&parsprep.super__Vector_base<double,_std::allocator<double>_>);
  std::_Function_base::~_Function_base(&Preproc.super__Function_base);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&arch.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main()
{
  // Define architecture
  const std::vector<int> arch{1, 5, 5, 2};

  // Define preprocessing function
  nnad::FeedForwardNN<double>::Preprocessing Preproc = [] (std::vector<double> const& in, std::vector<double> const& par) -> std::vector<double>
  {
    const double x = in[0];
    const double f1 = pow(x, par[0]) * pow(1 - x, par[1]);
    const double f2 = pow(x, par[2]) * pow(1 - x, par[3]);
    return {f1, f2, log(x) * f1, 0, log(1 - x) * f1, 0, 0, log(x) * f2, 0, log(1 - x) * f2};
  };

  // Preprocessing parameters
  const std::vector<double> parsprep{-1, 1, 2, 3};

  // Initialise NN needed for the numerical derivative
  const nnad::FeedForwardNN<double> nn{arch, 0, nnad::OutputFunction::LINEAR, true};

  // Initialise NN with preprocessing
  const nnad::FeedForwardNN<double> nnp{arch, 0, nnad::OutputFunction::QUADRATIC, true, Preproc, parsprep};

  // Input vector
  std::vector<double> x{0.001};
  std::cout << "Input: x = { ";
  for (auto const& e : x)
    std::cout << e << " ";
  std::cout << "}\n" << std::endl;

  // Get NNs at x
  const std::vector<double> nnl = nn.Evaluate(x);

  // Get preprocessing at x
  const std::vector<double> prepf = Preproc(x, parsprep);

  // Compute the derivatives numerically as incremental ratios
  const double eps = 1e-5;
  const std::vector<double> pars = nn.GetParameters();
  const int np = (int) pars.size();

  // Square and include preprocessing function
  std::vector<double> ders;
  for (int io = 0; io < arch.back(); io++)
    ders.push_back(pow(nnl[io], 2) * prepf[io]);

  // Loop over all derivatives w.r.t the NN parameters
  for (int ip = 0; ip < np; ip++)
    {
      // Displace ip-th parameter by "eps" up and down
      std::vector<double> parsp(pars.size());
      std::vector<double> parsm(pars.size());
      for (int jp = 0; jp < np; jp++)
        {
          parsp[jp] = (jp == ip ? pars[jp] * ( 1 + eps ) : pars[jp]);
          parsm[jp] = (jp == ip ? pars[jp] * ( 1 - eps ) : pars[jp]);
        }

      // Define NNs with the displaced parameters.
      const nnad::FeedForwardNN<double> nnp{arch, parsp};
      const nnad::FeedForwardNN<double> nnm{arch, parsm};

      // Get outputs and compute the derivative numerically
      const std::vector<double> vp = nnp.Evaluate(x);
      const std::vector<double> vm = nnm.Evaluate(x);

      for (int io = 0; io < arch.back(); io++)
        ders.push_back(2 * nnl[io] * ( vp[io] - vm[io] ) / 2 / eps / pars[ip] * prepf[io]);
    }

  // Now include derivatives w.r.t. the preprocessing parameters
  for (int ip = 0; ip < (int) parsprep.size(); ip++)
    {
      // Displace ip-th parameter by "eps" up and down
      std::vector<double> parsp(parsprep.size());
      std::vector<double> parsm(parsprep.size());
      for (int jp = 0; jp < parsprep.size(); jp++)
        {
          parsp[jp] = (jp == ip ? parsprep[jp] * ( 1 + eps ) : parsprep[jp]);
          parsm[jp] = (jp == ip ? parsprep[jp] * ( 1 - eps ) : parsprep[jp]);
        }

      // Define preprocessing function with the displaced parameters.
      const std::vector<double> vp = Preproc(x, parsp);
      const std::vector<double> vm = Preproc(x, parsm);

      for (int io = 0; io < arch.back(); io++)
        ders.push_back(pow(nnl[io], 2) * ( vp[io] - vm[io] ) / 2 / eps / parsprep[ip]);
    }

  // Compare derivatives
  const std::vector<double> anders = nnp.Derive(x);
  const int nd = (int) anders.size();
  std::cout << std::scientific;
  std::cout << "id\t num. ders.\t an. ders.\t   ratio" << std::endl;
  for (int id = 0; id < nd; id++)
    std::cout << id << "\t" << ders[id] << "\t" << anders[id] << "\t" << ( anders[id] == 0 ? 0 : ders[id] / anders[id] ) << std::endl;
  std::cout << "\n";

  return 0;
}